

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O2

void BASELINE::set_baseline_enabled(example *ec)

{
  unsigned_long *puVar1;
  float *pfVar2;
  
  pfVar2 = (ec->super_example_predict).feature_space[0x89].values._begin;
  puVar1 = (ec->super_example_predict).feature_space[0x89].indicies._begin;
  while( true ) {
    if (pfVar2 == (ec->super_example_predict).feature_space[0x89].values._end) {
      features::push_back((ec->super_example_predict).feature_space + 0x89,1.0,0x54d);
      return;
    }
    if (*puVar1 == 0x54d) break;
    pfVar2 = pfVar2 + 1;
    puVar1 = puVar1 + 1;
  }
  *pfVar2 = 1.0;
  return;
}

Assistant:

void set_baseline_enabled(example* ec)
{
  auto& fs = ec->feature_space[message_namespace];
  for (auto& f : fs)
  {
    if (f.index() == baseline_enabled_idx)
    {
      f.value() = 1;
      return;
    }
  }
  // if not found, push new feature
  fs.push_back(1, baseline_enabled_idx);
}